

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmakemain.cxx
# Opt level: O1

int do_cmake(int ac,char **av)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmState *pcVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  CacheEntryType type;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ulong uVar6;
  char *pcVar7;
  size_t sVar8;
  ostream *poVar9;
  bool in_DL;
  byte bVar10;
  WorkingMode WVar11;
  int iVar12;
  byte bVar13;
  pointer key;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> generators;
  cmake cm;
  cmDocumentation doc;
  string local_418;
  ulong local_3f8;
  WorkingMode local_3ec;
  ulong local_3e8;
  ulong local_3e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3d8;
  ulong local_3b8;
  int local_3ac;
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> local_3a8;
  undefined8 local_390;
  undefined1 local_388 [228];
  WorkingMode local_2a4;
  cmState *local_f8;
  cmDocumentation local_d8;
  
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            ((string *)local_388,(SystemTools *)0x1,in_DL);
  if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
    operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
  }
  if ((pointer)local_388._8_8_ == (pointer)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Current working directory cannot be established.",0x30);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
    uVar5 = 1;
  }
  else {
    cmDocumentation::cmDocumentation(&local_d8);
    cmDocumentation::addCMakeStandardDocSections(&local_d8);
    bVar3 = cmDocumentation::CheckOptions(&local_d8,ac,av,(char *)0x0);
    if (bVar3) {
      cmake::cmake((cmake *)local_388);
      paVar1 = &local_418.field_2;
      local_418._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"");
      cmake::SetHomeDirectory((cmake *)local_388,&local_418);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_dataplus._M_p != paVar1) {
        operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
      }
      local_418._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"");
      cmake::SetHomeOutputDirectory((cmake *)local_388,&local_418);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_dataplus._M_p != paVar1) {
        operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
      }
      cmake::AddCMakePaths((cmake *)local_388);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      vector<char_const*const*,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_3d8,av,
                 av + ac,(allocator_type *)&local_418);
      cmake::SetCacheArgs((cmake *)local_388,&local_3d8);
      local_3a8.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_3a8.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_3a8.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmake::GetGeneratorDocumentation((cmake *)local_388,&local_3a8);
      local_418._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"cmake","");
      cmDocumentation::SetName(&local_d8,&local_418);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_dataplus._M_p != paVar1) {
        operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
      }
      cmDocumentation::SetSection(&local_d8,"Name",cmDocumentationName);
      cmDocumentation::SetSection(&local_d8,"Usage",cmDocumentationUsage);
      if (ac == 1) {
        cmDocumentation::AppendSection(&local_d8,"Usage",cmDocumentationUsageNote);
      }
      cmDocumentation::AppendSection(&local_d8,"Generators",&local_3a8);
      cmDocumentation::PrependSection(&local_d8,"Options",cmDocumentationOptions);
      bVar3 = cmDocumentation::PrintRequestedDocumentation(&local_d8,(ostream *)&std::cout);
      uVar5 = (uint)!bVar3;
      std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::~vector(&local_3a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_3d8);
      cmake::~cmake((cmake *)local_388);
    }
    else {
      local_3d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_3d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_3d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (ac < 1) {
        uVar6 = 0;
        bVar10 = 0;
        local_3f8 = 0;
        local_3e8 = 0;
        bVar13 = 0;
        WVar11 = NORMAL_MODE;
      }
      else {
        local_3ac = ac + -1;
        iVar12 = 0;
        local_3ec = NORMAL_MODE;
        local_390 = 0;
        local_3e8 = 0;
        local_3f8 = 0;
        local_3b8 = 0;
        local_3e0 = 0;
        do {
          pcVar7 = av[iVar12];
          iVar4 = strcmp(pcVar7,"-i");
          if (iVar4 == 0) {
            uVar5 = 1;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "The \"cmake -i\" wizard mode is no longer supported.\nUse the -D option to set cache values on the command line.\nUse cmake-gui or ccmake for an interactive dialog.\n"
                       ,0xa1);
            goto LAB_00223508;
          }
          iVar4 = strcmp(pcVar7,"--system-information");
          if (iVar4 == 0) {
            local_3e0 = CONCAT71((int7)(CONCAT44(extraout_var,iVar4) >> 8),1);
          }
          else {
            iVar4 = strcmp(pcVar7,"-N");
            if (iVar4 == 0) {
              local_390 = CONCAT71((int7)(CONCAT44(extraout_var_00,iVar4) >> 8),1);
            }
            else {
              iVar4 = strcmp(pcVar7,"-L");
              if (iVar4 == 0) {
                local_3b8 = CONCAT71((int7)(CONCAT44(extraout_var_01,iVar4) >> 8),1);
              }
              else {
                iVar4 = strcmp(pcVar7,"-LA");
                if (iVar4 == 0) {
                  local_3f8 = CONCAT71((int7)(CONCAT44(extraout_var_02,iVar4) >> 8),1);
                }
                else {
                  iVar4 = strcmp(pcVar7,"-LH");
                  if (iVar4 == 0) {
                    uVar6 = CONCAT71((int7)(CONCAT44(extraout_var_03,iVar4) >> 8),1);
                    local_3b8 = uVar6;
                  }
                  else {
                    iVar4 = strcmp(pcVar7,"-LAH");
                    if (iVar4 != 0) {
                      iVar4 = strncmp(pcVar7,"-P",2);
                      if (iVar4 == 0) {
                        if (iVar12 == local_3ac) {
                          cmSystemTools::Error
                                    ("No script specified for argument -P",(char *)0x0,(char *)0x0,
                                     (char *)0x0);
                        }
                        else {
                          std::__cxx11::string::string
                                    ((string *)local_388,pcVar7,(allocator *)&local_418);
                          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                          emplace_back<std::__cxx11::string>
                                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                      *)&local_3d8,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_388);
                          if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
                            operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
                          }
                          std::__cxx11::string::string
                                    ((string *)local_388,av[(long)iVar12 + 1],
                                     (allocator *)&local_418);
                          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                          emplace_back<std::__cxx11::string>
                                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                      *)&local_3d8,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_388);
                          if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
                            operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
                          }
                          iVar12 = iVar12 + 1;
                          local_3ec = SCRIPT_MODE;
                        }
                      }
                      else {
                        iVar4 = strncmp(pcVar7,"--find-package",0xe);
                        if (iVar4 == 0) {
                          std::__cxx11::string::string
                                    ((string *)local_388,pcVar7,(allocator *)&local_418);
                          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                          emplace_back<std::__cxx11::string>
                                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                      *)&local_3d8,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_388);
                          if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
                            operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
                          }
                          local_3ec = FIND_PACKAGE_MODE;
                        }
                        else {
                          std::__cxx11::string::string
                                    ((string *)local_388,pcVar7,(allocator *)&local_418);
                          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                          emplace_back<std::__cxx11::string>
                                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                      *)&local_3d8,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_388);
                          if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
                            operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
                          }
                        }
                      }
                      goto LAB_00222f15;
                    }
                    uVar6 = CONCAT71((int7)(CONCAT44(extraout_var_04,iVar4) >> 8),1);
                    local_3f8 = uVar6;
                  }
                  local_3e8 = CONCAT71((int7)(uVar6 >> 8),1);
                }
              }
            }
          }
LAB_00222f15:
          iVar12 = iVar12 + 1;
        } while (iVar12 < ac);
        bVar10 = (byte)local_3b8 | (byte)local_3f8;
        bVar13 = (byte)local_390;
        uVar6 = local_3e0;
        WVar11 = local_3ec;
      }
      if ((uVar6 & 1) == 0) {
        cmake::cmake((cmake *)local_388);
        paVar1 = &local_418.field_2;
        local_418._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"");
        cmake::SetHomeDirectory((cmake *)local_388,&local_418);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418._M_dataplus._M_p != paVar1) {
          operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
        }
        local_418._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"");
        cmake::SetHomeOutputDirectory((cmake *)local_388,&local_418);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418._M_dataplus._M_p != paVar1) {
          operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
        }
        cmSystemTools::SetMessageCallback(cmakemainMessageCallback,local_388);
        cmake::SetProgressCallback((cmake *)local_388,cmakemainProgressCallback,(cmake *)local_388);
        local_2a4 = WVar11;
        iVar12 = cmake::Run((cmake *)local_388,&local_3d8,(bool)(bVar13 & 1));
        if ((bVar10 & 1) != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"-- Cache values",0xf);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
          std::ostream::put('h');
          std::ostream::flush();
          local_3e0 = CONCAT44(local_3e0._4_4_,iVar12);
          cmState::GetCacheEntryKeys_abi_cxx11_
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_3a8,local_f8);
          if (local_3a8.
              super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
              _M_impl.super__Vector_impl_data._M_start !=
              local_3a8.
              super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            local_3f8 = local_3f8 ^ 1;
            key = local_3a8.
                  super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
                  _M_impl.super__Vector_impl_data._M_start;
            do {
              type = cmState::GetCacheEntryType(local_f8,&key->Name);
              pcVar2 = local_f8;
              if (type + ~UNINITIALIZED < 0xfffffffd) {
                local_418._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"ADVANCED","");
                pcVar7 = cmState::GetCacheEntryProperty(pcVar2,&key->Name,&local_418);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_418._M_dataplus._M_p != paVar1) {
                  operator_delete(local_418._M_dataplus._M_p,
                                  local_418.field_2._M_allocated_capacity + 1);
                }
                if (((byte)local_3f8 & pcVar7 != (char *)0x0) == 0) {
                  if ((local_3e8 & 1) != 0) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"// ",3);
                    pcVar2 = local_f8;
                    local_418._M_dataplus._M_p = (pointer)paVar1;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_418,"HELPSTRING","");
                    pcVar7 = cmState::GetCacheEntryProperty(pcVar2,&key->Name,&local_418);
                    if (pcVar7 == (char *)0x0) {
                      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x5d9768);
                    }
                    else {
                      sVar8 = strlen(pcVar7);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,pcVar7,sVar8);
                    }
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
                    std::ostream::put('h');
                    std::ostream::flush();
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_418._M_dataplus._M_p != paVar1) {
                      operator_delete(local_418._M_dataplus._M_p,
                                      local_418.field_2._M_allocated_capacity + 1);
                    }
                  }
                  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)&std::cout,(key->Name)._M_dataplus._M_p,
                                      (key->Name)._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,":",1);
                  pcVar7 = cmState::CacheEntryTypeToString(type);
                  if (pcVar7 == (char *)0x0) {
                    std::ios::clear((int)poVar9 + (int)poVar9->_vptr_basic_ostream[-3]);
                  }
                  else {
                    sVar8 = strlen(pcVar7);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar7,sVar8);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"=",1);
                  pcVar7 = cmState::GetCacheEntryValue(local_f8,&key->Name);
                  if (pcVar7 == (char *)0x0) {
                    std::ios::clear((int)poVar9 + (int)poVar9->_vptr_basic_ostream[-3]);
                  }
                  else {
                    sVar8 = strlen(pcVar7);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar7,sVar8);
                  }
                  std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
                  std::ostream::put((char)poVar9);
                  std::ostream::flush();
                  if ((local_3e8 & 1) != 0) {
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
                    std::ostream::put('h');
                    std::ostream::flush();
                  }
                }
              }
              key = (pointer)&key->Brief;
            } while (key != local_3a8.
                            super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_3a8);
          iVar12 = (int)local_3e0;
        }
        uVar5 = (uint)(iVar12 != 0);
      }
      else {
        cmake::cmake((cmake *)local_388);
        paVar1 = &local_418.field_2;
        local_418._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"");
        cmake::SetHomeDirectory((cmake *)local_388,&local_418);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418._M_dataplus._M_p != paVar1) {
          operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
        }
        local_418._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"");
        cmake::SetHomeOutputDirectory((cmake *)local_388,&local_418);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418._M_dataplus._M_p != paVar1) {
          operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
        }
        uVar5 = cmake::GetSystemInformation((cmake *)local_388,&local_3d8);
      }
      cmake::~cmake((cmake *)local_388);
LAB_00223508:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_3d8);
    }
    cmDocumentation::~cmDocumentation(&local_d8);
  }
  return uVar5;
}

Assistant:

int do_cmake(int ac, char const* const* av)
{
  if (cmSystemTools::GetCurrentWorkingDirectory().empty())
    {
    std::cerr << "Current working directory cannot be established."
              << std::endl;
    return 1;
    }

#ifdef CMAKE_BUILD_WITH_CMAKE
  cmDocumentation doc;
  doc.addCMakeStandardDocSections();
  if(doc.CheckOptions(ac, av))
    {
    // Construct and print requested documentation.
    cmake hcm;
    hcm.SetHomeDirectory("");
    hcm.SetHomeOutputDirectory("");
    hcm.AddCMakePaths();

    // the command line args are processed here so that you can do
    // -DCMAKE_MODULE_PATH=/some/path and have this value accessible here
    std::vector<std::string> args(av, av + ac);
    hcm.SetCacheArgs(args);

    std::vector<cmDocumentationEntry> generators;

    hcm.GetGeneratorDocumentation(generators);

    doc.SetName("cmake");
    doc.SetSection("Name",cmDocumentationName);
    doc.SetSection("Usage",cmDocumentationUsage);
    if ( ac == 1 )
      {
      doc.AppendSection("Usage",cmDocumentationUsageNote);
      }
    doc.AppendSection("Generators",generators);
    doc.PrependSection("Options",cmDocumentationOptions);

    return doc.PrintRequestedDocumentation(std::cout)? 0:1;
    }
#else
  if ( ac == 1 )
    {
    std::cout <<
      "Bootstrap CMake should not be used outside CMake build process."
              << std::endl;
    return 0;
    }
#endif

  bool sysinfo = false;
  bool list_cached = false;
  bool list_all_cached = false;
  bool list_help = false;
  bool view_only = false;
  cmake::WorkingMode workingMode = cmake::NORMAL_MODE;
  std::vector<std::string> args;
  for(int i =0; i < ac; ++i)
    {
    if(strcmp(av[i], "-i") == 0)
      {
      std::cerr <<
        "The \"cmake -i\" wizard mode is no longer supported.\n"
        "Use the -D option to set cache values on the command line.\n"
        "Use cmake-gui or ccmake for an interactive dialog.\n";
      return 1;
      }
    else if(strcmp(av[i], "--system-information") == 0)
      {
      sysinfo = true;
      }
    else if (strcmp(av[i], "-N") == 0)
      {
      view_only = true;
      }
    else if (strcmp(av[i], "-L") == 0)
      {
      list_cached = true;
      }
    else if (strcmp(av[i], "-LA") == 0)
      {
      list_all_cached = true;
      }
    else if (strcmp(av[i], "-LH") == 0)
      {
      list_cached = true;
      list_help = true;
      }
    else if (strcmp(av[i], "-LAH") == 0)
      {
      list_all_cached = true;
      list_help = true;
      }
    else if (cmHasLiteralPrefix(av[i], "-P"))
      {
      if ( i == ac -1 )
        {
        cmSystemTools::Error("No script specified for argument -P");
        }
      else
        {
        workingMode = cmake::SCRIPT_MODE;
        args.push_back(av[i]);
        i++;
        args.push_back(av[i]);
        }
      }
    else if (cmHasLiteralPrefix(av[i], "--find-package"))
      {
      workingMode = cmake::FIND_PACKAGE_MODE;
      args.push_back(av[i]);
      }
    else
      {
      args.push_back(av[i]);
      }
    }
  if (sysinfo)
    {
    cmake cm;
    cm.SetHomeDirectory("");
    cm.SetHomeOutputDirectory("");
    int ret = cm.GetSystemInformation(args);
    return ret;
    }
  cmake cm;
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cmSystemTools::SetMessageCallback(cmakemainMessageCallback, (void *)&cm);
  cm.SetProgressCallback(cmakemainProgressCallback, (void *)&cm);
  cm.SetWorkingMode(workingMode);

  int res = cm.Run(args, view_only);
  if ( list_cached || list_all_cached )
    {
    std::cout << "-- Cache values" << std::endl;
    std::vector<std::string> keys = cm.GetState()->GetCacheEntryKeys();
    for (std::vector<std::string>::const_iterator it = keys.begin();
        it != keys.end(); ++it)
      {
      cmState::CacheEntryType t = cm.GetState()->GetCacheEntryType(*it);
      if (t != cmState::INTERNAL && t != cmState::STATIC &&
          t != cmState::UNINITIALIZED)
        {
        const char* advancedProp =
            cm.GetState()->GetCacheEntryProperty(*it, "ADVANCED");
        if ( list_all_cached || !advancedProp)
          {
          if ( list_help )
            {
            std::cout << "// "
                      << cm.GetState()->GetCacheEntryProperty(*it,
                                                   "HELPSTRING") << std::endl;
            }
          std::cout << *it << ":" <<
            cmState::CacheEntryTypeToString(t)
            << "=" << cm.GetState()->GetCacheEntryValue(*it)
            << std::endl;
          if ( list_help )
            {
            std::cout << std::endl;
            }
          }
        }
      }
    }

  // Always return a non-negative value.  Windows tools do not always
  // interpret negative return values as errors.
  if(res != 0)
    {
    return 1;
    }
  else
    {
    return 0;
    }
}